

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_0::CWriter::WritePrefixBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  iterator __position;
  size_t size;
  char (*in_R8) [3];
  Newline *in_R9;
  Opcode local_54;
  StackVar local_50 [2];
  Enum local_40;
  
  local_54.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_54);
  local_50[0].index = 0;
  local_50[0].type.enum_ = Any;
  Write(this,(StackVar *)0x1);
  WriteData(this," = ",3);
  size = strlen(op);
  WriteData(this,op,size);
  WriteData(this,"(",1);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(StackVar *)0x1,(char (*) [3])0x0,local_50,in_R8,in_R9);
  DropTypes(this,2);
  local_50[0].index = local_40;
  __position._M_current =
       (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&this->type_stack_,__position,
               (Type *)local_50);
  }
  else {
    (__position._M_current)->enum_ = local_40;
    (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void CWriter::WritePrefixBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(1, result_type), " = ", op, "(", StackVar(1), ", ",
        StackVar(0), ");", Newline());
  DropTypes(2);
  PushType(result_type);
}